

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O0

void __thiscall
vkt::pipeline::CoordinateCaptureFragmentShader::CoordinateCaptureFragmentShader
          (CoordinateCaptureFragmentShader *this)

{
  reference pvVar1;
  reference pvVar2;
  CoordinateCaptureFragmentShader *this_local;
  
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,2,1);
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_016a6340;
  pvVar1 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,0);
  pvVar1->type = GENERICVECTYPE_FLOAT;
  pvVar1 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,1);
  pvVar1->type = GENERICVECTYPE_FLOAT;
  pvVar2 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_outputs,0);
  pvVar2->type = GENERICVECTYPE_FLOAT;
  return;
}

Assistant:

CoordinateCaptureFragmentShader (void)
		: rr::FragmentShader(2, 1)
	{
		m_inputs[0].type	= rr::GENERICVECTYPE_FLOAT;
		m_inputs[1].type	= rr::GENERICVECTYPE_FLOAT;
		m_outputs[0].type	= rr::GENERICVECTYPE_FLOAT;
	}